

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.c
# Opt level: O1

void refreshMultiLine(linenoiseState *l,int flags)

{
  ulong uVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  char *pcVar8;
  char *pcVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  linenoiseState *plVar13;
  int iVar14;
  size_t sVar15;
  int iVar16;
  uint uVar17;
  long lVar18;
  char seq [64];
  abuf local_b0;
  ulong local_a0;
  linenoiseState *local_98;
  int local_8c;
  size_t local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined2 local_70;
  
  local_a0 = CONCAT44(local_a0._4_4_,flags);
  pcVar9 = l->prompt;
  sVar5 = strlen(pcVar9);
  sVar6 = promptTextColumnLen(pcVar9,sVar5);
  sVar7 = columnPosForMultiLine(l->buf,l->len,l->len,l->cols,sVar6);
  uVar10 = l->cols;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar10;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (sVar7 + uVar10 + sVar6) - 1;
  local_80 = SUB168(auVar4 / auVar3,0);
  iVar16 = (int)l->oldrows;
  local_8c = l->ofd;
  l->oldrows = (long)SUB164(auVar4 / auVar3,0);
  local_b0.b = (char *)0x0;
  local_b0.len = 0;
  uVar12 = l->oldcollen;
  uVar1 = l->len;
  local_98 = l;
  if (((uVar12 < uVar1) && (l->pos <= uVar10 && l->pos == uVar1)) &&
     (l->prev_history_index == l->history_index)) {
    pcVar9 = l->buf;
    sVar5 = strlen(pcVar9);
    uVar17 = (int)sVar5 - (int)uVar12;
    local_a0 = (ulong)(int)uVar17;
    pcVar8 = (char *)malloc(local_a0);
    if (pcVar8 != (char *)0x0) {
      memcpy(pcVar8,pcVar9 + uVar12,local_a0);
      local_b0.b = pcVar8;
      local_b0.len = uVar17;
    }
    plVar13 = local_98;
    pcVar9 = local_b0.b;
    local_98->oldcolpos = sVar7;
    local_98->oldcollen = uVar1;
    write(local_8c,local_b0.b,(long)local_b0.len);
    free(pcVar9);
    plVar13->prev_history_index = plVar13->history_index;
    return;
  }
  pcVar9 = local_b0.b;
  uVar17 = local_b0.len;
  local_88 = sVar6;
  if ((local_a0 & 1) != 0) {
    if ((int)((uVar10 + sVar6 + l->oldcolpos) / uVar10) < iVar16) {
      snprintf((char *)&local_78,0x40,"\x1b[%dB");
      sVar5 = strlen((char *)&local_78);
      uVar17 = (uint)sVar5;
      pcVar9 = (char *)malloc((long)(int)uVar17);
      if (pcVar9 != (char *)0x0) {
        memcpy(pcVar9,&local_78,(long)(int)uVar17);
        local_b0.b = pcVar9;
        local_b0.len = uVar17;
      }
    }
    pcVar9 = local_b0.b;
    uVar17 = local_b0.len;
    if (1 < iVar16) {
      iVar16 = iVar16 + -1;
      do {
        local_78 = 0x315b1b4b305b1b0d;
        local_70 = 0x41;
        sVar5 = strlen((char *)&local_78);
        uVar11 = (int)sVar5 + uVar17;
        pcVar8 = (char *)realloc(pcVar9,(long)(int)uVar11);
        if (pcVar8 != (char *)0x0) {
          memcpy(pcVar8 + (int)uVar17,&local_78,(long)(int)sVar5);
          pcVar9 = pcVar8;
          uVar17 = uVar11;
        }
        iVar16 = iVar16 + -1;
      } while (iVar16 != 0);
    }
  }
  local_b0.len = uVar17;
  local_b0.b = pcVar9;
  if ((local_a0 & 3) != 0) {
    local_78 = CONCAT26(local_78._6_2_,0x4b00000000);
    local_78 = CONCAT44(local_78._4_4_,0x305b1b0d);
    sVar5 = strlen((char *)&local_78);
    lVar18 = (long)local_b0.len;
    sVar15 = (int)sVar5 + lVar18;
    pcVar9 = (char *)realloc(local_b0.b,sVar15);
    if (pcVar9 != (char *)0x0) {
      memcpy(pcVar9 + lVar18,&local_78,(long)(int)sVar5);
      local_b0.len = (int)sVar15;
      local_b0.b = pcVar9;
    }
  }
  plVar13 = local_98;
  uVar10 = columnPosForMultiLine(local_98->buf,local_98->len,local_98->pos,local_98->cols,local_88);
  if ((local_a0 & 2) == 0) goto LAB_0010b2a3;
  pcVar9 = plVar13->prompt;
  local_a0 = uVar10;
  sVar5 = strlen(pcVar9);
  lVar18 = (long)local_b0.len;
  sVar15 = (int)sVar5 + lVar18;
  pcVar8 = (char *)realloc(local_b0.b,sVar15);
  if (pcVar8 != (char *)0x0) {
    memcpy(pcVar8 + lVar18,pcVar9,(long)(int)sVar5);
    local_b0.len = (int)sVar15;
    local_b0.b = pcVar8;
  }
  plVar13 = local_98;
  if (maskmode == '\x01') {
    pcVar8 = local_b0.b;
    if (local_98->len == 0) {
      uVar10 = (ulong)(uint)local_b0.len;
    }
    else {
      uVar12 = 1;
      uVar17 = local_b0.len;
      do {
        pcVar9 = (char *)realloc(pcVar8,(long)(int)(uVar17 + 1));
        if (pcVar9 != (char *)0x0) {
          pcVar9[(int)uVar17] = '*';
          pcVar8 = pcVar9;
          uVar17 = uVar17 + 1;
        }
        uVar10 = (ulong)uVar17;
        bVar2 = uVar12 < plVar13->len;
        uVar12 = (ulong)((int)uVar12 + 1);
      } while (bVar2);
    }
LAB_0010b0a0:
    local_b0.len = (int)uVar10;
    local_b0.b = pcVar8;
  }
  else {
    pcVar9 = local_98->buf;
    lVar18 = (long)local_b0.len;
    iVar16 = (int)local_98->len;
    uVar10 = iVar16 + lVar18;
    pcVar8 = (char *)realloc(local_b0.b,uVar10);
    if (pcVar8 != (char *)0x0) {
      memcpy(pcVar8 + lVar18,pcVar9,(long)iVar16);
      goto LAB_0010b0a0;
    }
  }
  sVar6 = local_88;
  plVar13 = local_98;
  refreshShowHints(&local_b0,local_98,(int)local_88);
  iVar16 = (int)local_80;
  iVar14 = (int)local_a0;
  if (((plVar13->pos != 0) && (plVar13->pos == plVar13->len)) &&
     (((long)iVar14 + sVar6) % plVar13->cols == 0)) {
    lVar18 = (long)local_b0.len;
    sVar5 = lVar18 + 1;
    pcVar9 = (char *)realloc(local_b0.b,sVar5);
    if (pcVar9 != (char *)0x0) {
      pcVar9[lVar18] = '\n';
      local_b0.len = (int)sVar5;
      local_b0.b = pcVar9;
    }
    local_78 = CONCAT62(local_78._2_6_,0xd);
    sVar5 = strlen((char *)&local_78);
    lVar18 = (long)local_b0.len;
    sVar15 = (int)sVar5 + lVar18;
    pcVar9 = (char *)realloc(local_b0.b,sVar15);
    if (pcVar9 != (char *)0x0) {
      memcpy(pcVar9 + lVar18,&local_78,(long)(int)sVar5);
      local_b0.len = (int)sVar15;
      local_b0.b = pcVar9;
    }
    iVar16 = (int)local_80 + 1;
    iVar14 = (int)local_a0;
    sVar6 = local_88;
    if ((int)plVar13->oldrows <= (int)local_80) {
      plVar13->oldrows = (long)iVar16;
    }
  }
  if ((int)((plVar13->cols + (long)iVar14 + sVar6) / plVar13->cols) < iVar16) {
    snprintf((char *)&local_78,0x40,"\x1b[%dA");
    sVar5 = strlen((char *)&local_78);
    lVar18 = (long)local_b0.len;
    sVar15 = (int)sVar5 + lVar18;
    pcVar9 = (char *)realloc(local_b0.b,sVar15);
    if (pcVar9 != (char *)0x0) {
      memcpy(pcVar9 + lVar18,&local_78,(long)(int)sVar5);
      local_b0.len = (int)sVar15;
      local_b0.b = pcVar9;
    }
  }
  if ((int)(((long)iVar14 + sVar6) % local_98->cols) == 0) {
    local_78 = CONCAT62(local_78._2_6_,0xd);
  }
  else {
    snprintf((char *)&local_78,0x40,"\r\x1b[%dC");
  }
  sVar5 = strlen((char *)&local_78);
  lVar18 = (long)local_b0.len;
  sVar15 = (int)sVar5 + lVar18;
  pcVar9 = (char *)realloc(local_b0.b,sVar15);
  plVar13 = local_98;
  uVar10 = local_a0;
  if (pcVar9 != (char *)0x0) {
    memcpy(pcVar9 + lVar18,&local_78,(long)(int)sVar5);
    local_b0.len = (int)sVar15;
    local_b0.b = pcVar9;
  }
LAB_0010b2a3:
  pcVar9 = local_b0.b;
  plVar13->oldcolpos = (long)(int)uVar10;
  plVar13->oldcollen = plVar13->len;
  plVar13->prev_history_index = plVar13->history_index;
  write(local_8c,local_b0.b,(long)local_b0.len);
  free(pcVar9);
  return;
}

Assistant:

static void refreshMultiLine(struct linenoiseState *l, int flags) {
    char seq[64];
    size_t pcollen = promptTextColumnLen(l->prompt,strlen(l->prompt));
    size_t colpos = columnPosForMultiLine(l->buf, l->len, l->len, l->cols, pcollen);
    int colpos2; /* cursor column position. */
    int rows = (pcollen+colpos+l->cols-1)/l->cols; /* rows used by current buf. */
    int rpos = (pcollen+l->oldcolpos+l->cols)/l->cols; /* cursor relative row. */
    int rpos2; /* rpos after refresh. */
    int col; /* column position, zero-based. */
    int old_rows = l->oldrows;
    int fd = l->ofd, j;
    struct abuf ab;

    l->oldrows = rows;

    /* First step: clear all the lines used before. To do so start by
     * going to the last row. */
    abInit(&ab);

    if ((l->oldcollen < l->len) && // some character was added
            (l->pos == l->len) && // at the end of the line
            (l->pos <= l->cols) && // no multiline break
            (l->prev_history_index == l->history_index) // no buffer change based on history
            ) {
        /* Ignore flags and just add one character.
         * This code was added because redundant ANSI escape codes make tcl-tests incapable.
         */
        abAppend(&ab,l->buf + l->oldcollen,strlen(l->buf) - l->oldcollen);
        l->oldcolpos = colpos;
        l->oldcollen = l->len;
        if (write(fd,ab.b,ab.len) == -1) {} /* Can't recover from write error. */
        abFree(&ab);
        l->prev_history_index = l->history_index;
        return;
    }

    if (flags & REFRESH_CLEAN) {
        if (old_rows-rpos > 0) {
            lndebug("go down %d", old_rows-rpos);
            snprintf(seq,64,"\x1b[%dB", old_rows-rpos);
            abAppend(&ab,seq,strlen(seq));
        }

        /* Now for every row clear it, go up. */
        for (j = 0; j < old_rows-1; j++) {
            lndebug("clear+up");
            snprintf(seq,64,"\r\x1b[0K\x1b[1A");
            abAppend(&ab,seq,strlen(seq));
        }
    }

    if (flags & REFRESH_ALL) {
        /* Clean the top line. */
        lndebug("clear");
        snprintf(seq,64,"\r\x1b[0K");
        abAppend(&ab,seq,strlen(seq));
    }

    /* Get column length to cursor position */
    colpos2 = columnPosForMultiLine(l->buf,l->len,l->pos,l->cols,pcollen);

    if (flags & REFRESH_WRITE) {
        /* Write the prompt and the current buffer content */
        abAppend(&ab,l->prompt,strlen(l->prompt));
        if (maskmode == 1) {
            unsigned int i;
            for (i = 0; i < l->len; i++) abAppend(&ab,"*",1);
        } else {
            abAppend(&ab,l->buf,l->len);
        }

        /* Show hits if any. */
        refreshShowHints(&ab,l,pcollen);

        /* If we are at the very end of the screen with our prompt, we need to
         * emit a newline and move the prompt to the first column. */
        if (l->pos &&
            l->pos == l->len &&
            (colpos2+pcollen) % l->cols == 0)
        {
            lndebug("<newline>");
            abAppend(&ab,"\n",1);
            snprintf(seq,64,"\r");
            abAppend(&ab,seq,strlen(seq));
            rows++;
            if (rows > (int)l->oldrows) l->oldrows = rows;
        }

        /* Move cursor to right position. */
        rpos2 = (pcollen+colpos2+l->cols)/l->cols; /* Current cursor relative row */
        lndebug("rpos2 %d", rpos2);

        /* Go up till we reach the expected position. */
        if (rows-rpos2 > 0) {
            lndebug("go-up %d", rows-rpos2);
            snprintf(seq,64,"\x1b[%dA", rows-rpos2);
            abAppend(&ab,seq,strlen(seq));
        }

        /* Set column. */
        col = (pcollen+colpos2) % l->cols;
        lndebug("set col %d", 1+col);
        if (col)
            snprintf(seq,64,"\r\x1b[%dC", col);
        else
            snprintf(seq,64,"\r");
        abAppend(&ab,seq,strlen(seq));
    }

    lndebug("\n");
    l->oldcolpos = colpos2;
    l->oldcollen = l->len;
    l->prev_history_index = l->history_index;

    if (write(fd,ab.b,ab.len) == -1) {} /* Can't recover from write error. */
    abFree(&ab);
}